

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp5::groebnerRow7_20000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  lVar19 = (long)targetRow;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x23c];
  auVar18._8_8_ = 0x8000000000000000;
  auVar18._0_8_ = 0x8000000000000000;
  auVar20 = vxorpd_avx512vl(auVar21,auVar18);
  auVar22._0_8_ =
       auVar20._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa83];
  auVar22._8_8_ = auVar20._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x23c] = 0.0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xaaf];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x268];
  auVar20 = vfmadd213sd_fma(auVar23,auVar22,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x268] = auVar20._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xadb];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x294];
  auVar20 = vfmadd213sd_fma(auVar24,auVar22,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x294] = auVar20._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb07];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x2c0];
  auVar20 = vfmadd213sd_fma(auVar25,auVar22,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x2c0] = auVar20._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb33];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x2ec];
  auVar20 = vfmadd213sd_fma(auVar26,auVar22,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x2ec] = auVar20._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb5f];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x318];
  auVar20 = vfmadd213sd_fma(auVar27,auVar22,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x318] = auVar20._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb8b];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x344];
  auVar20 = vfmadd213sd_fma(auVar28,auVar22,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x344] = auVar20._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[2999];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x370];
  auVar20 = vfmadd213sd_fma(auVar29,auVar22,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x370] = auVar20._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x39c];
  auVar20 = vfmadd213sd_fma(auVar30,auVar22,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x39c] = auVar20._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc0f];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x3c8];
  auVar20 = vfmadd213sd_fma(auVar31,auVar22,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x3c8] = auVar20._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3b];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar19 + 0x3f4];
  auVar20 = vfmadd213sd_fma(auVar32,auVar22,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x3f4] = auVar20._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc67];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x420];
  auVar20 = vfmadd213sd_fma(auVar33,auVar22,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x420] = auVar20._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc93];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x44c];
  auVar20 = vfmadd213sd_fma(auVar34,auVar22,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x44c] = auVar20._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcbf];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x948];
  auVar20 = vfmadd213sd_fma(auVar35,auVar22,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x948] = auVar20._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xceb];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x974];
  auVar20 = vfmadd213sd_fma(auVar36,auVar22,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x974] = auVar20._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd17];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x9a0];
  auVar20 = vfmadd213sd_fma(auVar37,auVar22,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x9a0] = auVar20._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd43];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x9cc];
  auVar20 = vfmadd213sd_fma(auVar38,auVar22,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x9cc] = auVar20._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd6f];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0x9f8];
  auVar20 = vfmadd213sd_fma(auVar39,auVar22,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0x9f8] = auVar20._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd9b];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar19 + 0xc8c];
  auVar20 = vfmadd213sd_fma(auVar40,auVar22,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar19 + 0xc8c] = auVar20._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow7_20000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,13) / groebnerMatrix(7,61);
  groebnerMatrix(targetRow,13) = 0.0;
  groebnerMatrix(targetRow,14) -= factor * groebnerMatrix(7,62);
  groebnerMatrix(targetRow,15) -= factor * groebnerMatrix(7,63);
  groebnerMatrix(targetRow,16) -= factor * groebnerMatrix(7,64);
  groebnerMatrix(targetRow,17) -= factor * groebnerMatrix(7,65);
  groebnerMatrix(targetRow,18) -= factor * groebnerMatrix(7,66);
  groebnerMatrix(targetRow,19) -= factor * groebnerMatrix(7,67);
  groebnerMatrix(targetRow,20) -= factor * groebnerMatrix(7,68);
  groebnerMatrix(targetRow,21) -= factor * groebnerMatrix(7,69);
  groebnerMatrix(targetRow,22) -= factor * groebnerMatrix(7,70);
  groebnerMatrix(targetRow,23) -= factor * groebnerMatrix(7,71);
  groebnerMatrix(targetRow,24) -= factor * groebnerMatrix(7,72);
  groebnerMatrix(targetRow,25) -= factor * groebnerMatrix(7,73);
  groebnerMatrix(targetRow,54) -= factor * groebnerMatrix(7,74);
  groebnerMatrix(targetRow,55) -= factor * groebnerMatrix(7,75);
  groebnerMatrix(targetRow,56) -= factor * groebnerMatrix(7,76);
  groebnerMatrix(targetRow,57) -= factor * groebnerMatrix(7,77);
  groebnerMatrix(targetRow,58) -= factor * groebnerMatrix(7,78);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(7,79);
}